

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

string * __thiscall
cmCTestGIT::CommitParser::FormatDateTime_abi_cxx11_
          (string *__return_storage_ptr__,CommitParser *this,Person *person)

{
  tm *ptVar1;
  size_t sVar2;
  long lVar3;
  char *__format;
  time_t seconds;
  char tz [32];
  char dt [1024];
  
  seconds = person->Time;
  ptVar1 = gmtime(&seconds);
  sprintf(dt,"%04d-%02d-%02d %02d:%02d:%02d",(ulong)(ptVar1->tm_year + 0x76c),
          (ulong)(ptVar1->tm_mon + 1),(ulong)(uint)ptVar1->tm_mday,(ulong)(uint)ptVar1->tm_hour,
          (ulong)(uint)ptVar1->tm_min,(ulong)(uint)ptVar1->tm_sec);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(dt);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,dt,dt + sVar2);
  lVar3 = person->TimeZone;
  if (lVar3 < 0) {
    lVar3 = -lVar3;
    __format = " -%04ld";
  }
  else {
    __format = " +%04ld";
  }
  sprintf(tz,__format,lVar3);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatDateTime(Person const& person)
  {
    // Convert the time to a human-readable format that is also easy
    // to machine-parse: "CCYY-MM-DD hh:mm:ss".
    time_t seconds = static_cast<time_t>(person.Time);
    struct tm* t = gmtime(&seconds);
    char dt[1024];
    sprintf(dt, "%04d-%02d-%02d %02d:%02d:%02d", t->tm_year + 1900,
            t->tm_mon + 1, t->tm_mday, t->tm_hour, t->tm_min, t->tm_sec);
    std::string out = dt;

    // Add the time-zone field "+zone" or "-zone".
    char tz[32];
    if (person.TimeZone >= 0) {
      sprintf(tz, " +%04ld", person.TimeZone);
    } else {
      sprintf(tz, " -%04ld", -person.TimeZone);
    }
    out += tz;
    return out;
  }